

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O0

void __thiscall StunMsg_BasicBindingRequest_Test::TestBody(StunMsg_BasicBindingRequest_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_hdr_00;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_4;
  stun_attr_hdr *attr_hdr;
  Message local_160;
  size_t local_158;
  unsigned_long local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_3;
  Message local_130;
  uint16_t local_126;
  stun_msg_type local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_f0;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_;
  stun_msg_hdr *msg_hdr;
  Message local_c0;
  int local_b8 [2];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_98;
  Message local_90 [3];
  unsigned_long local_78 [2];
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  uint8_t tsx_id [12];
  uint8_t buffer [20];
  undefined1 auStack_28 [8];
  uint8_t expected_result [20];
  StunMsg_BasicBindingRequest_Test *this_local;
  
  auStack_28 = (undefined1  [8])0x42a4122100000100;
  expected_result[0] = 0xfd;
  expected_result[1] = 0x95;
  expected_result[2] = 0xe8;
  expected_result[3] = 0x83;
  expected_result[4] = 0x8a;
  expected_result[5] = '\x05';
  expected_result[6] = '(';
  expected_result[7] = 'E';
  expected_result[8] = 'j';
  expected_result[9] = 0x8e;
  expected_result[10] = 0xf1;
  expected_result[0xb] = 0xe2;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4528058a83e895fd;
  tsx_id[0] = 'j';
  tsx_id[1] = 0x8e;
  tsx_id[2] = 0xf1;
  tsx_id[3] = 0xe2;
  local_78[1] = 0x14;
  local_78[0] = 0x14;
  unique0x100007d1 = this;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_68,"sizeof(expected_result)","sizeof(buffer)",local_78 + 1,
             local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(local_90);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_b8[1] = 1;
    local_b8[0] = stun_msg_verify((stun_msg_hdr *)auStack_28,0x14);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_b0,"1",
               "stun_msg_verify((stun_msg_hdr*)expected_result, sizeof(expected_result))",
               local_b8 + 1,local_b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar1) {
      testing::Message::Message(&local_c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&msg_hdr,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                 ,0x5e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&msg_hdr,&local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&msg_hdr);
      testing::Message::~Message(&local_c0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      msg_hdr_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(tsx_id + 8)
      ;
      gtest_ar_.message_.ptr_ = msg_hdr_00;
      stun_msg_hdr_init((stun_msg_hdr *)msg_hdr_00,1,(uint8_t *)&gtest_ar.message_);
      anon_unknown.dwarf_39c4::IsEqual
                ((anon_unknown_dwarf_39c4 *)local_e0,auStack_28,msg_hdr_00,0x14);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
      if (!bVar1) {
        testing::Message::Message(&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_2.message_,(internal *)local_e0,
                   (AssertionResult *)"IsEqual(expected_result, buffer, sizeof(expected_result))",
                   "false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,100,pcVar2);
        testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_28;
      local_124 = STUN_BINDING_REQUEST;
      local_126 = stun_msg_type((stun_msg_hdr *)gtest_ar_.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<stun_msg_type,unsigned_short>
                ((EqHelper<false> *)local_120,"STUN_BINDING_REQUEST","stun_msg_type(msg_hdr)",
                 &local_124,&local_126);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
      if (!bVar1) {
        testing::Message::Message(&local_130);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x68,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_130);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_130);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
      local_150 = 0x14;
      local_158 = stun_msg_len((stun_msg_hdr *)gtest_ar_.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_148,"sizeof(stun_msg_hdr)","stun_msg_len(msg_hdr)",
                 &local_150,&local_158);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
      if (!bVar1) {
        testing::Message::Message(&local_160);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&attr_hdr,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x69,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&attr_hdr,&local_160);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&attr_hdr);
        testing::Message::~Message(&local_160);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
      gtest_ar_4.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           stun_msg_next_attr(gtest_ar_.message_.ptr_,(stun_attr_hdr *)0x0);
      testing::internal::EqHelper<true>::Compare<_stun_attr_hdr_const>
                ((EqHelper<true> *)local_180,"__null","attr_hdr",(Secret *)0x0,
                 (_stun_attr_hdr *)gtest_ar_4.message_.ptr_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
      if (!bVar1) {
        testing::Message::Message(&local_188);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
        testing::internal::AssertHelper::AssertHelper
                  (&local_190,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x6c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_190,&local_188);
        testing::internal::AssertHelper::~AssertHelper(&local_190);
        testing::Message::~Message(&local_188);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    }
  }
  return;
}

Assistant:

TEST(StunMsg, BasicBindingRequest) {
  const uint8_t expected_result[] = {
    0x00,0x01,0x00,0x00, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xfd,0x95,0xe8,0x83, // }
    0x8a,0x05,0x28,0x45, // }  Transaction ID
    0x6a,0x8e,0xf1,0xe2  // }
  };
  
  uint8_t buffer[sizeof(stun_msg_hdr)];

  uint8_t tsx_id[12] = {
    0xfd,0x95,0xe8,0x83,
    0x8a,0x05,0x28,0x45,
    0x6a,0x8e,0xf1,0xe2
  };

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  stun_msg_hdr_init(msg_hdr, STUN_BINDING_REQUEST, tsx_id);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_REQUEST, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(stun_msg_hdr), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(NULL, attr_hdr);
}